

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpgradeAI.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::UpgradeAI::step(UpgradeAI *this)

{
  _Elt_pointer pvVar1;
  IUpgradeble *pIVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  pointer ppVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  int local_34;
  
  local_34 = world::Town::getArrmor(this->town);
  pvVar1 = (this->upgradeQueue).c.
           super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->upgradeQueue).c.
      super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pvVar1) {
    return;
  }
  ppVar5 = (pvVar1->
           super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    uVar11 = 0;
    iVar10 = 0;
    do {
      pIVar2 = ppVar5[uVar11].first;
      iVar4 = ppVar5[uVar11].second;
      iVar3 = (*pIVar2->_vptr_IUpgradeble[2])(pIVar2);
      if (((iVar3 + 1 == iVar4) &&
          (iVar4 = (*pIVar2->_vptr_IUpgradeble[3])(pIVar2), iVar4 < local_34 - this->RESERV_ARMOR))
         && (iVar4 = (*pIVar2->_vptr_IUpgradeble[5])(pIVar2), (char)iVar4 != '\0')) {
        (*pIVar2->_vptr_IUpgradeble[4])(pIVar2);
        iVar4 = (*pIVar2->_vptr_IUpgradeble[3])(pIVar2);
        ppVar5 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar6 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((ppVar5 + uVar11 + 1 != ppVar6) &&
           (lVar7 = (long)ppVar6 - (long)(ppVar5 + uVar11 + 1) >> 4, 0 < lVar7)) {
          uVar8 = lVar7 + 1;
          piVar9 = &ppVar5[uVar11 + 1].second;
          do {
            *(IUpgradeble **)(piVar9 + -6) =
                 ((pair<tiger::trains::world::IUpgradeble_*,_int> *)(piVar9 + -2))->first;
            piVar9[-4] = *piVar9;
            uVar8 = uVar8 - 1;
            piVar9 = piVar9 + 4;
          } while (1 < uVar8);
        }
        local_34 = local_34 - iVar4;
        ppVar6 = ppVar6 + -1;
        (pvVar1->
        super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppVar6;
      }
      else {
        iVar10 = iVar10 + 1;
        ppVar5 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar6 = (pvVar1->
                 super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar11 = (ulong)iVar10;
    } while (uVar11 < (ulong)((long)ppVar6 - (long)ppVar5 >> 4));
    if (ppVar5 != ppVar6) {
      return;
    }
  }
  std::
  deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
  ::pop_front(&(this->upgradeQueue).c);
  return;
}

Assistant:

void UpgradeAI::step()
{
    int ar = town->getArrmor();

    if (upgradeQueue.empty())
        return;

    std::vector<std::pair<world::IUpgradeble *, int>> &upgradeVector = upgradeQueue.front();

    int i = 0;

    while (i < upgradeVector.size())
    {
        world::IUpgradeble *target = upgradeVector[i].first;
        int level = upgradeVector[i].second;

        if (target->getLevel() + 1 == level &&
                target->getNextLevelPrice() < ar - RESERV_ARMOR &&
                target->isReadyToUpgrade())
        {
            target->upgrade();
            ar -= target->getNextLevelPrice();
            upgradeVector.erase(upgradeVector.begin() + i);
        }
        else
            i++;
    }

    if (upgradeVector.empty())
        upgradeQueue.pop();

}